

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O3

Vector3D * __thiscall
CGL::CosineWeightedHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,CosineWeightedHemisphereSampler3D *this,double *pdf)

{
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)minstd_engine);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = rVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = rVar3;
  auVar8 = vpunpcklqdq_avx(auVar8,auVar7);
  auVar7 = vpblendd_avx2(auVar8,(undefined1  [16])0x0,10);
  auVar14._8_8_ = 0x4330000000000000;
  auVar14._0_8_ = 0x4330000000000000;
  auVar7 = vpor_avx(auVar7,auVar14);
  auVar8 = vpsrlq_avx(auVar8,0x20);
  auVar15._8_8_ = 0x4530000000000000;
  auVar15._0_8_ = 0x4530000000000000;
  auVar8 = vpor_avx(auVar8,auVar15);
  auVar16._8_8_ = 0x4530000000100000;
  auVar16._0_8_ = 0x4530000000100000;
  auVar8 = vsubpd_avx(auVar8,auVar16);
  auVar9._0_8_ = (auVar7._0_8_ + auVar8._0_8_) * 2.3283064370807974e-10;
  auVar9._8_8_ = (auVar7._8_8_ + auVar8._8_8_) * 2.3283064370807974e-10;
  auVar13._8_8_ = 0x3e7ad7f29abcaf48;
  auVar13._0_8_ = 0x3e7ad7f29abcaf48;
  auVar8 = vmaxpd_avx(auVar13,auVar9);
  auVar10._8_8_ = 0x3feffffffaa19c47;
  auVar10._0_8_ = 0x3feffffffaa19c47;
  auVar7 = vcmppd_avx(auVar10,auVar8,1);
  uVar1 = vmovmskpd_avx(auVar7);
  if ((uVar1 & 2) == 0) {
    auVar7 = vshufpd_avx(auVar8,auVar8,1);
  }
  else {
    auVar7 = ZEXT816(0x3feffffffaa19c47);
  }
  if ((uVar1 & 1) == 0) {
    dVar5 = auVar8._0_8_ * 6.283185307179586;
  }
  else {
    dVar5 = 6.283185244347733;
  }
  auVar8 = vsqrtsd_avx(auVar7,auVar7);
  dVar6 = 1.0 - auVar7._0_8_;
  if (dVar6 < 0.0) {
    dVar4 = sqrt(dVar6);
  }
  else {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar6;
    auVar7 = vsqrtsd_avx(auVar11,auVar11);
    dVar4 = auVar7._0_8_;
  }
  *pdf = dVar4 / 3.141592653589793;
  dVar4 = cos(dVar5);
  dVar5 = sin(dVar5);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar6;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    auVar7 = vsqrtsd_avx(auVar12,auVar12);
    dVar6 = auVar7._0_8_;
  }
  (__return_storage_ptr__->field_0).field_0.x = dVar4 * auVar8._0_8_;
  (__return_storage_ptr__->field_0).field_0.y = dVar5 * auVar8._0_8_;
  (__return_storage_ptr__->field_0).field_0.z = dVar6;
  return __return_storage_ptr__;
}

Assistant:

Vector3D CosineWeightedHemisphereSampler3D::get_sample(double *pdf) const {

  double Xi1 = random_uniform();
  double Xi2 = random_uniform();

  double r = sqrt(Xi1);
  double theta = 2. * PI * Xi2;
  *pdf = sqrt(1-Xi1) / PI;
  return Vector3D(r*cos(theta), r*sin(theta), sqrt(1-Xi1));
}